

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec,int *vidx,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *rhs,int *ridx,int rn,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              eps)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  pointer pnVar5;
  int *piVar6;
  int *piVar7;
  fpclass_type fVar8;
  int32_t iVar9;
  bool bVar10;
  type_conflict5 tVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  uint *puVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar23;
  int *piVar24;
  byte bVar25;
  int rn_local;
  ulong local_5b8;
  int local_5ac;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5a8;
  uint *local_5a0;
  int *local_598;
  int local_58c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_4b8;
  cpp_dec_float<200U,_int,_void> local_438;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar25 = 0;
  local_4b8.fpclass = cpp_dec_float_finite;
  local_4b8.prec_elem = 0x1c;
  local_4b8.data._M_elems[0] = 0;
  local_4b8.data._M_elems[1] = 0;
  local_4b8.data._M_elems[2] = 0;
  local_4b8.data._M_elems[3] = 0;
  local_4b8.data._M_elems[4] = 0;
  local_4b8.data._M_elems[5] = 0;
  local_4b8.data._M_elems[6] = 0;
  local_4b8.data._M_elems[7] = 0;
  local_4b8.data._M_elems[8] = 0;
  local_4b8.data._M_elems[9] = 0;
  local_4b8.data._M_elems[10] = 0;
  local_4b8.data._M_elems[0xb] = 0;
  local_4b8.data._M_elems[0xc] = 0;
  local_4b8.data._M_elems[0xd] = 0;
  local_4b8.data._M_elems[0xe] = 0;
  local_4b8.data._M_elems[0xf] = 0;
  local_4b8.data._M_elems[0x10] = 0;
  local_4b8.data._M_elems[0x11] = 0;
  local_4b8.data._M_elems[0x12] = 0;
  local_4b8.data._M_elems[0x13] = 0;
  local_4b8.data._M_elems[0x14] = 0;
  local_4b8.data._M_elems[0x15] = 0;
  local_4b8.data._M_elems[0x16] = 0;
  local_4b8.data._M_elems[0x17] = 0;
  local_4b8.data._M_elems[0x18] = 0;
  local_4b8.data._M_elems[0x19] = 0;
  local_4b8.data._M_elems._104_5_ = 0;
  local_4b8.data._M_elems[0x1b]._1_3_ = 0;
  local_4b8.exp = 0;
  local_4b8.neg = false;
  local_438.fpclass = cpp_dec_float_finite;
  local_438.prec_elem = 0x1c;
  local_438.data._M_elems[0] = 0;
  local_438.data._M_elems[1] = 0;
  local_438.data._M_elems[2] = 0;
  local_438.data._M_elems[3] = 0;
  local_438.data._M_elems[4] = 0;
  local_438.data._M_elems[5] = 0;
  local_438.data._M_elems[6] = 0;
  local_438.data._M_elems[7] = 0;
  local_438.data._M_elems[8] = 0;
  local_438.data._M_elems[9] = 0;
  local_438.data._M_elems[10] = 0;
  local_438.data._M_elems[0xb] = 0;
  local_438.data._M_elems[0xc] = 0;
  local_438.data._M_elems[0xd] = 0;
  local_438.data._M_elems[0xe] = 0;
  local_438.data._M_elems[0xf] = 0;
  local_438.data._M_elems[0x10] = 0;
  local_438.data._M_elems[0x11] = 0;
  local_438.data._M_elems[0x12] = 0;
  local_438.data._M_elems[0x13] = 0;
  local_438.data._M_elems[0x14] = 0;
  local_438.data._M_elems[0x15] = 0;
  local_438.data._M_elems[0x16] = 0;
  local_438.data._M_elems[0x17] = 0;
  local_438.data._M_elems[0x18] = 0;
  local_438.data._M_elems[0x19] = 0;
  local_438.data._M_elems._104_5_ = 0;
  local_438.data._M_elems[0x1b]._1_3_ = 0;
  local_438.exp = 0;
  local_438.neg = false;
  piVar2 = (this->row).orig;
  piVar24 = (this->row).perm;
  piVar3 = (this->col).orig;
  piVar4 = (this->u).col.idx;
  pnVar5 = (this->u).col.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar6 = (this->u).col.len;
  piVar7 = (this->u).col.start;
  local_5b8 = 0;
  rn_local = rn;
  local_5a8 = rhs;
  local_5a0 = (uint *)ridx;
  do {
    do {
      if (rn_local < 1) goto LAB_003f621b;
      iVar12 = deQueueMax((int *)local_5a0,&rn_local);
      iVar13 = piVar2[iVar12];
      pcVar18 = &local_5a8[iVar13].m_backend;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_1.m_backend,
                 &(this->diag).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend,pcVar18);
      lVar16 = 0x1c;
      pcVar21 = &result_1.m_backend;
      pcVar22 = &local_4b8;
      for (lVar15 = lVar16; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pcVar22->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar25 * -8 + 4);
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar25 * -2 + 1) * 4);
      }
      local_4b8.exp = result_1.m_backend.exp;
      local_4b8.neg = result_1.m_backend.neg;
      local_4b8.fpclass = result_1.m_backend.fpclass;
      local_4b8.prec_elem = result_1.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar18,0);
      pcVar18 = &local_4b8;
      pnVar23 = &local_b0;
      for (lVar15 = lVar16; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar23->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + ((ulong)bVar25 * -2 + 1) * 4);
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + ((ulong)bVar25 * -2 + 1) * 4);
      }
      local_b0.m_backend.exp = local_4b8.exp;
      local_b0.m_backend.neg = local_4b8.neg;
      local_b0.m_backend.fpclass = local_4b8.fpclass;
      local_b0.m_backend.prec_elem = local_4b8.prec_elem;
      puVar20 = (uint *)eps.m_backend.data._M_elems._0_8_;
      pnVar23 = &local_130;
      for (; lVar16 != 0; lVar16 = lVar16 + -1) {
        (pnVar23->m_backend).data._M_elems[0] = *puVar20;
        puVar20 = puVar20 + (ulong)bVar25 * -2 + 1;
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + ((ulong)bVar25 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = *(int *)(eps.m_backend.data._M_elems._0_8_ + 0x70);
      local_130.m_backend.neg = *(bool *)(eps.m_backend.data._M_elems._0_8_ + 0x74);
      local_130.m_backend._120_8_ = *(undefined8 *)(eps.m_backend.data._M_elems._0_8_ + 0x78);
      bVar10 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_b0,&local_130);
    } while (!bVar10);
    iVar13 = piVar3[iVar12];
    vidx[local_5b8 & 0xffffffff] = iVar13;
    pcVar18 = &local_4b8;
    pnVar23 = vec + iVar13;
    for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
      (pnVar23->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
      pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + ((ulong)bVar25 * -2 + 1) * 4);
      pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar23 + ((ulong)bVar25 * -2 + 1) * 4);
    }
    vec[iVar13].m_backend.exp = local_4b8.exp;
    vec[iVar13].m_backend.neg = local_4b8.neg;
    vec[iVar13].m_backend.fpclass = local_4b8.fpclass;
    vec[iVar13].m_backend.prec_elem = local_4b8.prec_elem;
    iVar1 = piVar7[iVar13];
    piVar17 = piVar4 + iVar1;
    pcVar18 = &pnVar5[iVar1].m_backend;
    iVar13 = piVar6[iVar13];
    local_5ac = iVar12;
    while (lVar16 = 0x1c, 0 < iVar13) {
      iVar1 = *piVar17;
      pnVar23 = local_5a8 + iVar1;
      pnVar19 = pnVar23;
      pcVar21 = &local_438;
      for (lVar15 = lVar16; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pcVar21->data)._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar25 * -8 + 4);
      }
      local_438.exp = local_5a8[iVar1].m_backend.exp;
      local_438.neg = local_5a8[iVar1].m_backend.neg;
      local_438.fpclass = local_5a8[iVar1].m_backend.fpclass;
      local_438.prec_elem = local_5a8[iVar1].m_backend.prec_elem;
      result_1.m_backend.data._M_elems._0_8_ =
           result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      local_598 = piVar17;
      local_58c = iVar13;
      tVar11 = boost::multiprecision::operator==
                         ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_438,(int *)&result_1.m_backend);
      if (tVar11) {
        pcVar21 = &local_4b8;
        pnVar19 = &result;
        for (lVar15 = lVar16; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pnVar19->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar25 * -2 + 1) * 4)
          ;
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
        }
        result.m_backend.exp = local_4b8.exp;
        result.m_backend.neg = local_4b8.neg;
        result.m_backend.fpclass = local_4b8.fpclass;
        result.m_backend.prec_elem = local_4b8.prec_elem;
        if (local_4b8.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(local_4b8.neg ^ 1);
        }
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,&result.m_backend,pcVar18);
        pcVar21 = &result_1.m_backend;
        pcVar22 = &local_438;
        for (lVar15 = lVar16; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar22->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar25 * -8 + 4);
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar25 * -2 + 1) * 4)
          ;
        }
        local_438.exp = result_1.m_backend.exp;
        local_438.neg = result_1.m_backend.neg;
        fVar8 = result_1.m_backend.fpclass;
        iVar9 = result_1.m_backend.prec_elem;
        local_438.fpclass = result_1.m_backend.fpclass;
        local_438.prec_elem = result_1.m_backend.prec_elem;
        pcVar21 = &local_438;
        pnVar19 = &local_330;
        for (lVar15 = lVar16; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pnVar19->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar25 * -2 + 1) * 4)
          ;
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
        }
        local_330.m_backend.exp = result_1.m_backend.exp;
        local_330.m_backend.neg = result_1.m_backend.neg;
        local_330.m_backend.fpclass = fVar8;
        local_330.m_backend.prec_elem = iVar9;
        puVar20 = (uint *)eps.m_backend.data._M_elems._0_8_;
        pnVar19 = &local_1b0;
        for (lVar15 = lVar16; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pnVar19->m_backend).data._M_elems[0] = *puVar20;
          puVar20 = puVar20 + (ulong)bVar25 * -2 + 1;
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = *(int *)(eps.m_backend.data._M_elems._0_8_ + 0x70);
        local_1b0.m_backend.neg = *(bool *)(eps.m_backend.data._M_elems._0_8_ + 0x74);
        local_1b0.m_backend._120_8_ = *(undefined8 *)(eps.m_backend.data._M_elems._0_8_ + 0x78);
        bVar10 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_330,&local_1b0);
        iVar12 = local_5ac;
        if (bVar10) {
          pcVar21 = &local_438;
          pnVar19 = pnVar23;
          for (; lVar16 != 0; lVar16 = lVar16 + -1) {
            (pnVar19->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar21 + ((ulong)bVar25 * -2 + 1) * 4);
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
          }
          (pnVar23->m_backend).exp = local_438.exp;
          (pnVar23->m_backend).neg = local_438.neg;
          (pnVar23->m_backend).fpclass = local_438.fpclass;
          (pnVar23->m_backend).prec_elem = local_438.prec_elem;
          enQueueMax((int *)local_5a0,&rn_local,piVar24[iVar1]);
        }
      }
      else {
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,&local_4b8,pcVar18);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_438,&result_1.m_backend);
        result.m_backend.data._M_elems[0] = 0;
        tVar11 = boost::multiprecision::operator==
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_438,(int *)&result);
        result_1.m_backend.data._M_elems[0] = 0xe48e0530;
        result_1.m_backend.data._M_elems[1] = 0x2b2bff2e;
        if (!tVar11) {
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
        }
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                  (&local_438,(double *)&result_1);
        pcVar21 = &local_438;
        pnVar19 = pnVar23;
        for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
          (pnVar19->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar25 * -8 + 4);
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
        }
        (pnVar23->m_backend).exp = local_438.exp;
        (pnVar23->m_backend).neg = local_438.neg;
        (pnVar23->m_backend).fpclass = local_438.fpclass;
        (pnVar23->m_backend).prec_elem = local_438.prec_elem;
        iVar12 = local_5ac;
      }
      piVar17 = local_598 + 1;
      pcVar18 = pcVar18 + 1;
      iVar13 = local_58c + -1;
    }
    local_5b8 = (ulong)((int)local_5b8 + 1);
  } while ((double)rn_local <= (double)iVar12 * 0.2);
  lVar16 = 0x1c;
  uVar14 = *local_5a0;
  while (-1 < (int)uVar14) {
    local_598 = (int *)CONCAT44(local_598._4_4_,uVar14);
    iVar13 = piVar2[uVar14];
    pcVar18 = &local_5a8[iVar13].m_backend;
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x1c;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.data._M_elems[0x10] = 0;
    result_1.m_backend.data._M_elems[0x11] = 0;
    result_1.m_backend.data._M_elems[0x12] = 0;
    result_1.m_backend.data._M_elems[0x13] = 0;
    result_1.m_backend.data._M_elems[0x14] = 0;
    result_1.m_backend.data._M_elems[0x15] = 0;
    result_1.m_backend.data._M_elems[0x16] = 0;
    result_1.m_backend.data._M_elems[0x17] = 0;
    result_1.m_backend.data._M_elems[0x18] = 0;
    result_1.m_backend.data._M_elems[0x19] = 0;
    result_1.m_backend.data._M_elems._104_5_ = 0;
    result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_1.m_backend,
               &(this->diag).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend,pcVar18);
    pcVar21 = &result_1.m_backend;
    pcVar22 = &local_4b8;
    for (lVar15 = lVar16; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pcVar22->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar25 * -8 + 4);
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar25 * -8 + 4);
    }
    local_4b8.exp = result_1.m_backend.exp;
    local_4b8.neg = result_1.m_backend.neg;
    local_4b8.fpclass = result_1.m_backend.fpclass;
    local_4b8.prec_elem = result_1.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar18,0);
    pcVar18 = &local_4b8;
    pnVar23 = &local_230;
    for (lVar15 = lVar16; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pnVar23->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
      pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4);
      pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar23 + ((ulong)bVar25 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = local_4b8.exp;
    local_230.m_backend.neg = local_4b8.neg;
    local_230.m_backend.fpclass = local_4b8.fpclass;
    local_230.m_backend.prec_elem = local_4b8.prec_elem;
    puVar20 = (uint *)eps.m_backend.data._M_elems._0_8_;
    pnVar23 = &local_2b0;
    for (lVar15 = lVar16; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pnVar23->m_backend).data._M_elems[0] = *puVar20;
      puVar20 = puVar20 + (ulong)bVar25 * -2 + 1;
      pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar23 + ((ulong)bVar25 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = *(int *)(eps.m_backend.data._M_elems._0_8_ + 0x70);
    local_2b0.m_backend.neg = *(bool *)(eps.m_backend.data._M_elems._0_8_ + 0x74);
    local_2b0.m_backend._120_8_ = *(undefined8 *)(eps.m_backend.data._M_elems._0_8_ + 0x78);
    bVar10 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_230,&local_2b0);
    if (bVar10) {
      iVar13 = piVar3[uVar14];
      vidx[(int)local_5b8] = iVar13;
      pcVar18 = &local_4b8;
      pnVar23 = vec + iVar13;
      for (lVar15 = lVar16; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar23->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4);
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + ((ulong)bVar25 * -2 + 1) * 4);
      }
      vec[iVar13].m_backend.exp = local_4b8.exp;
      vec[iVar13].m_backend.neg = local_4b8.neg;
      vec[iVar13].m_backend.fpclass = local_4b8.fpclass;
      vec[iVar13].m_backend.prec_elem = local_4b8.prec_elem;
      iVar12 = piVar7[iVar13];
      piVar24 = piVar4 + iVar12;
      pcVar18 = &pnVar5[iVar12].m_backend;
      for (iVar13 = piVar6[iVar13]; 0 < iVar13; iVar13 = iVar13 + -1) {
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,&local_4b8,pcVar18);
        iVar12 = *piVar24;
        piVar24 = piVar24 + 1;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_5a8[iVar12].m_backend,&result_1.m_backend);
        pcVar18 = pcVar18 + 1;
      }
      local_5b8 = (ulong)((int)local_5b8 + 1);
    }
    uVar14 = (int)local_598 - 1;
  }
LAB_003f621b:
  return (int)local_5b8;
}

Assistant:

int CLUFactor<R>::vSolveUright(R* vec, int* vidx,
                               R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c, n;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   n = 0;

   while(rn > 0)
   {
      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);
      assert(i >= 0 && i < thedim);
      r = rorig[i];
      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];
      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         assert(c >= 0 && c < thedim);
         vidx[n++] = c;
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            assert(*idx >= 0 && *idx < thedim);
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }

         if(rn > i * verySparseFactor4right)
         {
            /* continue with dense case */
            for(i = *ridx; i >= 0; --i)
            {
               r = rorig[i];
               assert(r >= 0 && r < thedim);
               x = diag[r] * rhs[r];
               rhs[r] = 0;

               if(isNotZero(x, eps))
               {
                  c = corig[i];
                  assert(c >= 0 && c < thedim);
                  vidx[n++] = c;
                  vec[c] = x;
                  val = &cval[cbeg[c]];
                  idx = &cidx[cbeg[c]];
                  j = clen[c];

                  while(j-- > 0)
                  {
                     assert(*idx >= 0 && *idx < thedim);
                     rhs[*idx++] -= x * (*val++);
                  }
               }
            }

            break;
         }
      }
   }

   return n;
}